

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall
Omega_h::HostWrite<double>::HostWrite
          (HostWrite<double> *this,LO size_in,double offset,double stride,string *name_in)

{
  Write<double> local_20;
  
  Write<double>::Write(&local_20,size_in,offset,stride,name_in);
  Write<double>::Write(&this->write_,&local_20);
  Write<double>::~Write(&local_20);
  return;
}

Assistant:

HostWrite<T>::HostWrite(
    LO size_in, T offset, T stride, std::string const& name_in)
    : HostWrite<T>(Write<T>(size_in, offset, stride, name_in)) {}